

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O0

string * __thiscall GPIOClass::get_gpionum_abi_cxx11_(GPIOClass *this)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

string GPIOClass::get_gpionum(){

return this->gpionum;

}